

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_SetPointerPluginTest_installTwoFunctionPointer_Test::testBody
          (TEST_SetPointerPluginTest_installTwoFunctionPointer_Test *this)

{
  TestRegistry *pTVar1;
  size_t sVar2;
  UtestShell *this_00;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  bool bVar5;
  
  this_00 = (UtestShell *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x4f);
  this_00->_vptr_UtestShell = (_func_int **)0x0;
  this_00->group_ = (char *)0x0;
  this_00->name_ = (char *)0x0;
  this_00->file_ = (char *)0x0;
  this_00->lineNumber_ = 0;
  this_00->next_ = (UtestShell *)0x0;
  this_00->isRunAsSeperateProcess_ = false;
  this_00->hasFailed_ = false;
  *(undefined6 *)&this_00->field_0x32 = 0;
  UtestShell::UtestShell(this_00);
  this_00->_vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_003520f0;
  fp1 = orig_func1;
  fp2 = orig_func2;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,this_00);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[5])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pUVar3 = UtestShell::getCurrent();
  bVar5 = fp1 == orig_func1;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar5,"CHECK","fp1 == orig_func1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x55,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  bVar5 = fp2 == orig_func2;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar5,"CHECK","fp2 == orig_func2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x56,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  sVar2 = ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_)->failureCount_;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,sVar2,"LONGS_EQUAL(0, result_->getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x57,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  sVar2 = ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_)->checkCount_;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,sVar2,"LONGS_EQUAL(2, result_->getCheckCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x58,pTVar4);
  (*this_00->_vptr_UtestShell[1])(this_00);
  return;
}

Assistant:

TEST(SetPointerPluginTest, installTwoFunctionPointer)
{
    FunctionPointerUtestShell *tst = new FunctionPointerUtestShell();

    fp1 = orig_func1;
    fp2 = orig_func2;
    myRegistry_->addTest(tst);
    myRegistry_->runAllTests(*result_);
    CHECK(fp1 == orig_func1);
    CHECK(fp2 == orig_func2);
    LONGS_EQUAL(0, result_->getFailureCount());
    LONGS_EQUAL(2, result_->getCheckCount());
    delete tst;
}